

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_cb_dir(uv_fs_event_t *handle,char *filename,int events,int status)

{
  char *path;
  size_t sVar1;
  int iVar2;
  uv_loop_t *puVar3;
  size_t sVar4;
  uv_fs_event_t *loop;
  long lVar5;
  size_t sStack_448;
  char acStack_440 [1032];
  
  fs_event_cb_called = fs_event_cb_called + 1;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_0014f1db;
    if (events != 2) goto LAB_0014f1e0;
    iVar2 = strcmp(filename,"file1");
    if (iVar2 != 0) goto LAB_0014f1e5;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0014f1db:
    fs_event_cb_dir_cold_2();
LAB_0014f1e0:
    fs_event_cb_dir_cold_3();
LAB_0014f1e5:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  do {
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    if (iVar2 != 0) {
LAB_0014f3e4:
      run_test_fs_event_getpath_cold_1();
      goto LAB_0014f3e9;
    }
    sStack_448 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_440,&sStack_448);
    if (iVar2 != -0x16) {
LAB_0014f3df:
      run_test_fs_event_getpath_cold_2();
      goto LAB_0014f3e4;
    }
    path = *(char **)((long)&DAT_001e1c10 + lVar5);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,path,0);
    if (iVar2 != 0) {
LAB_0014f3da:
      run_test_fs_event_getpath_cold_3();
      goto LAB_0014f3df;
    }
    sStack_448 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_440,&sStack_448);
    sVar1 = sStack_448;
    if (iVar2 != -0x69) {
LAB_0014f3d5:
      run_test_fs_event_getpath_cold_4();
      goto LAB_0014f3da;
    }
    if (0x3ff < sStack_448) {
LAB_0014f3d0:
      run_test_fs_event_getpath_cold_5();
      goto LAB_0014f3d5;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4 + 1) {
LAB_0014f3cb:
      run_test_fs_event_getpath_cold_6();
      goto LAB_0014f3d0;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_440,&sStack_448);
    sVar1 = sStack_448;
    if (iVar2 != 0) {
LAB_0014f3c6:
      run_test_fs_event_getpath_cold_7();
      goto LAB_0014f3cb;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4) {
LAB_0014f3c1:
      run_test_fs_event_getpath_cold_8();
      goto LAB_0014f3c6;
    }
    iVar2 = strcmp(acStack_440,path);
    if (iVar2 != 0) {
LAB_0014f3bc:
      run_test_fs_event_getpath_cold_9();
      goto LAB_0014f3c1;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_0014f3b7:
      run_test_fs_event_getpath_cold_10();
      goto LAB_0014f3bc;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_0014f3b7;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  remove("watch_dir/");
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    return;
  }
LAB_0014f3e9:
  run_test_fs_event_getpath_cold_12();
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_event_error_reporting_cold_1();
  loop = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init((uv_loop_t *)loop,&fs_event);
  if (iVar2 == 0) {
    loop = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_0014f4e6;
    loop = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 != 0) goto LAB_0014f4eb;
    loop = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_0014f4f0;
    loop = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close((uv_loop_t *)loop);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0014f4fa;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_0014f4e6:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_0014f4eb:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_0014f4f0:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_0014f4fa:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void fs_event_cb_dir(uv_fs_event_t* handle, const char* filename,
  int events, int status) {
  ++fs_event_cb_called;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strcmp(filename, "file1") == 0);
  #else
  ASSERT(filename == NULL || strcmp(filename, "file1") == 0);
  #endif
  ASSERT(0 == uv_fs_event_stop(handle));
  uv_close((uv_handle_t*)handle, close_cb);
}